

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

RtreeSearchPoint * rtreeEnqueue(RtreeCursor *pCur,RtreeDValue rScore,u8 iLevel)

{
  uint uVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  RtreeSearchPoint *pRVar5;
  RtreeSearchPoint *pRVar6;
  uint j;
  uint i;
  
  j = pCur->nPoint;
  iVar3 = pCur->nPointAlloc;
  if ((int)j < iVar3) {
    pRVar6 = pCur->aPoint;
LAB_001cc1fa:
    pCur->nPoint = j + 1;
    pRVar6 = pRVar6 + (int)j;
    pRVar6->rScore = rScore;
    pRVar6->iLevel = iLevel;
    pRVar5 = pRVar6;
    if (0 < (int)j) {
      do {
        uVar1 = j - 1;
        i = uVar1 >> 1;
        pRVar6 = pCur->aPoint + i;
        if (pRVar6->rScore <= pRVar5->rScore) {
          if (pRVar6->rScore < pRVar5->rScore) {
            return pRVar5;
          }
          if (pRVar6->iLevel <= pRVar5->iLevel) {
            return pRVar5;
          }
        }
        rtreeSearchPointSwap(pCur,i,j);
        pRVar5 = pRVar6;
        j = i;
      } while (1 < uVar1);
    }
  }
  else {
    pRVar6 = pCur->aPoint;
    iVar4 = sqlite3_initialize();
    if (iVar4 == 0) {
      lVar2 = (long)iVar3 * 2 + 8;
      pRVar6 = (RtreeSearchPoint *)sqlite3Realloc(pRVar6,lVar2 * 0x18);
      if (pRVar6 != (RtreeSearchPoint *)0x0) {
        pCur->aPoint = pRVar6;
        pCur->nPointAlloc = (int)lVar2;
        j = pCur->nPoint;
        goto LAB_001cc1fa;
      }
    }
    pRVar6 = (RtreeSearchPoint *)0x0;
  }
  return pRVar6;
}

Assistant:

static RtreeSearchPoint *rtreeEnqueue(
  RtreeCursor *pCur,    /* The cursor */
  RtreeDValue rScore,   /* Score for the new search point */
  u8 iLevel             /* Level for the new search point */
){
  int i, j;
  RtreeSearchPoint *pNew;
  if( pCur->nPoint>=pCur->nPointAlloc ){
    int nNew = pCur->nPointAlloc*2 + 8;
    pNew = sqlite3_realloc64(pCur->aPoint, nNew*sizeof(pCur->aPoint[0]));
    if( pNew==0 ) return 0;
    pCur->aPoint = pNew;
    pCur->nPointAlloc = nNew;
  }
  i = pCur->nPoint++;
  pNew = pCur->aPoint + i;
  pNew->rScore = rScore;
  pNew->iLevel = iLevel;
  assert( iLevel<=RTREE_MAX_DEPTH );
  while( i>0 ){
    RtreeSearchPoint *pParent;
    j = (i-1)/2;
    pParent = pCur->aPoint + j;
    if( rtreeSearchPointCompare(pNew, pParent)>=0 ) break;
    rtreeSearchPointSwap(pCur, j, i);
    i = j;
    pNew = pParent;
  }
  return pNew;
}